

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

OrderCancelRequest * __thiscall
Application::queryOrderCancelRequest44(OrderCancelRequest *__return_storage_ptr__,Application *this)

{
  Application *this_00;
  FieldBase *pFVar1;
  FieldBase local_170;
  FieldBase local_118;
  FieldBase local_c0;
  FieldBase local_68;
  
  this_00 = this;
  queryOrigClOrdID((OrigClOrdID *)&local_170,this);
  queryClOrdID((ClOrdID *)&local_68,this_00);
  querySide((Side *)&local_c0,this_00);
  FIX::TransactTime::TransactTime((TransactTime *)&local_118);
  pFVar1 = &local_170;
  FIX44::OrderCancelRequest::OrderCancelRequest
            (__return_storage_ptr__,(OrigClOrdID *)pFVar1,(ClOrdID *)&local_68,(Side *)&local_c0,
             (TransactTime *)&local_118);
  FIX::FieldBase::~FieldBase(&local_118);
  FIX::FieldBase::~FieldBase(&local_c0);
  FIX::FieldBase::~FieldBase(&local_68);
  FIX::FieldBase::~FieldBase(&local_170);
  querySymbol((Symbol *)&local_170,(Application *)pFVar1);
  pFVar1 = &local_170;
  FIX44::OrderCancelRequest::set(__return_storage_ptr__,(Symbol *)pFVar1);
  FIX::FieldBase::~FieldBase(&local_170);
  queryOrderQty((OrderQty *)&local_170,(Application *)pFVar1);
  FIX44::OrderCancelRequest::set(__return_storage_ptr__,(OrderQty *)&local_170);
  FIX::FieldBase::~FieldBase(&local_170);
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  return __return_storage_ptr__;
}

Assistant:

FIX44::OrderCancelRequest Application::queryOrderCancelRequest44() {
  FIX44::OrderCancelRequest orderCancelRequest(queryOrigClOrdID(), queryClOrdID(), querySide(), FIX::TransactTime());

  orderCancelRequest.set(querySymbol());
  orderCancelRequest.set(queryOrderQty());
  queryHeader(orderCancelRequest.getHeader());
  return orderCancelRequest;
}